

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btreeblock.cc
# Opt level: O2

void * btreeblk_enlarge_node(void *voidhandle,bid_t old_bid,size_t req_size,bid_t *new_bid)

{
  uint uVar1;
  bid_t bid;
  int iVar2;
  int iVar3;
  void *pvVar4;
  bid_t *pbVar5;
  undefined8 *puVar6;
  long *plVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  ulong bid_00;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  uint sb_no;
  ulong uVar18;
  bool bVar19;
  void *local_58;
  
  if ((char)(old_bid >> 0x30) == '\0') {
    return (void *)0x0;
  }
  uVar12 = (ulong)((uint)(old_bid >> 0x35) & 7);
  lVar10 = uVar12 - 1;
  uVar17 = (ulong)((ushort)(old_bid >> 0x30) & 0x1f);
  bid_00 = old_bid & 0xffffffffffff;
  lVar9 = *(long *)((long)voidhandle + 0x60);
  do {
    uVar18 = uVar12;
    if (*(uint *)((long)voidhandle + 0x58) <= (uint)uVar18) {
      uVar18 = 0;
      break;
    }
    uVar12 = (ulong)((uint)uVar18 + 1);
  } while (*(uint *)(lVar9 + 8 + uVar18 * 0x18) <= req_size);
  lVar11 = lVar10 * 0x18;
  lVar16 = 0;
  for (uVar12 = 0; *(ushort *)(lVar9 + 0xc + lVar11) != uVar12; uVar12 = uVar12 + 1) {
    lVar16 = (lVar16 + 1) - (ulong)(*(char *)(((ulong *)(lVar9 + lVar11))[2] + uVar12) == '\0');
  }
  sb_no = (uint)uVar18;
  iVar2 = (int)lVar10;
  if (uVar18 != 0) {
    lVar10 = uVar18 * 0x18;
    uVar8 = (ulong)*(ushort *)(lVar9 + lVar10 + 0xc);
    lVar14 = 0;
    uVar12 = uVar8;
    for (uVar13 = 0; uVar8 != uVar13; uVar13 = uVar13 + 1) {
      uVar15 = uVar12;
      if (uVar12 == uVar8) {
        uVar15 = uVar13;
      }
      bVar19 = *(char *)(*(long *)(lVar9 + lVar10 + 0x10) + uVar13) != '\0';
      if (!bVar19) {
        uVar12 = uVar15;
      }
      lVar14 = lVar14 + (ulong)bVar19;
    }
    if (lVar14 != 0) {
      pvVar4 = _btreeblk_read(voidhandle,bid_00,iVar2);
      iVar2 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),
                                  *(bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar10));
      lVar9 = *(long *)((long)voidhandle + 0x60);
      if ((iVar2 == 0) || (uVar12 == *(ushort *)(lVar9 + 0xc + lVar10))) {
        local_58 = _btreeblk_alloc(voidhandle,(bid_t *)(lVar9 + lVar10),sb_no);
        uVar12 = 0;
        memset(*(void **)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar10),0,
               (ulong)*(ushort *)(*(long *)((long)voidhandle + 0x60) + 0xc + lVar10));
      }
      else {
        local_58 = _btreeblk_read(voidhandle,*(bid_t *)(lVar9 + lVar10),sb_no);
        btreeblk_set_dirty(voidhandle,*(bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar10));
      }
      uVar8 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar11);
      memcpy((void *)(*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar10) * uVar12 +
                     (long)local_58),(void *)((long)pvVar4 + uVar17 * uVar8),uVar8);
      *(undefined1 *)(*(long *)(*(long *)((long)voidhandle + 0x60) + 0x10 + lVar10) + uVar12) = 1;
      lVar10 = *(long *)((long)voidhandle + 0x60) + lVar11;
      uVar8 = *(ulong *)(*(long *)((long)voidhandle + 0x60) + lVar11);
      if (bid_00 == uVar8) {
        *(undefined1 *)(*(long *)(lVar10 + 0x10) + uVar17) = 0;
      }
      else if (uVar8 != 0xffffffffffffffff) {
        uVar1 = *(uint *)(lVar10 + 8);
        _btreeblk_add_stale_block
                  ((btreeblk_handle *)voidhandle,uVar17 * uVar1 + bid_00 * *voidhandle,uVar1);
      }
      goto LAB_0010f840;
    }
  }
  if (((lVar16 != 1) || (bid_00 != *(ulong *)(lVar9 + lVar11))) ||
     (iVar3 = filemgr_is_writable(*(filemgr **)((long)voidhandle + 0x38),bid_00), iVar3 == 0)) {
    pvVar4 = _btreeblk_read(voidhandle,bid_00,iVar2);
    if (uVar18 == 0) {
      local_58 = btreeblk_alloc(voidhandle,new_bid);
      uVar12 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar11);
      memcpy(local_58,(void *)((long)pvVar4 + uVar17 * uVar12),uVar12);
    }
    else {
      local_58 = _btreeblk_alloc(voidhandle,
                                 (bid_t *)(*(long *)((long)voidhandle + 0x60) + uVar18 * 0x18),sb_no
                                );
      uVar12 = (ulong)*(uint *)(*(long *)((long)voidhandle + 0x60) + 8 + lVar11);
      memcpy(local_58,(void *)((long)pvVar4 + uVar17 * uVar12),uVar12);
      **(undefined1 **)(*(long *)((long)voidhandle + 0x60) + 0x10 + uVar18 * 0x18) = 1;
    }
    lVar10 = *(long *)((long)voidhandle + 0x60) + lVar11;
    if (bid_00 == *(ulong *)(*(long *)((long)voidhandle + 0x60) + lVar11)) {
      *(undefined1 *)(*(long *)(lVar10 + 0x10) + uVar17) = 0;
    }
    else {
      uVar1 = *(uint *)(lVar10 + 8);
      _btreeblk_add_stale_block
                ((btreeblk_handle *)voidhandle,uVar17 * uVar1 + bid_00 * *voidhandle,uVar1);
    }
    uVar12 = 0;
    goto LAB_0010f840;
  }
  local_58 = _btreeblk_read(voidhandle,bid_00,iVar2);
  bid = *(bid_t *)(*(long *)((long)voidhandle + 0x60) + lVar11);
  pbVar5 = (bid_t *)(uVar18 * 0x18 + *(long *)((long)voidhandle + 0x60));
  if (uVar18 == 0) {
    pbVar5 = new_bid;
  }
  *pbVar5 = bid;
  btreeblk_set_dirty(voidhandle,bid);
  lVar10 = *(long *)((long)voidhandle + 0x60);
  uVar12 = (*(ulong *)(lVar10 + lVar11) & 0xffffffffffff) / (ulong)*(ushort *)((long)voidhandle + 4)
  ;
  plVar7 = (long *)((long)voidhandle + 0x18);
  while (lVar9 = *plVar7, lVar9 != 0) {
    if (*(ulong *)(lVar9 + -0x20) == uVar12) goto LAB_0010f8a9;
    plVar7 = (long *)(lVar9 + 8);
  }
  plVar7 = (long *)((long)voidhandle + 0x28);
  while (lVar9 = *plVar7, lVar9 != 0) {
    if (*(ulong *)(lVar9 + -0x20) == uVar12) goto LAB_0010f8a9;
    plVar7 = (long *)(lVar9 + 8);
  }
LAB_0010f8ac:
  if (uVar17 != 0) {
    uVar12 = (ulong)*(uint *)(lVar10 + 8 + lVar11);
    memmove(local_58,(void *)((long)local_58 + uVar17 * uVar12),uVar12);
    lVar10 = *(long *)((long)voidhandle + 0x60);
  }
  if (uVar18 != 0) {
    **(undefined1 **)(lVar10 + 0x10 + uVar18 * 0x18) = 1;
    lVar10 = *(long *)((long)voidhandle + 0x60);
  }
  if (bid_00 == *(ulong *)(lVar10 + lVar11)) {
    puVar6 = (undefined8 *)(lVar10 + lVar11);
    *puVar6 = 0xffffffffffffffff;
    uVar12 = 0;
    memset((void *)puVar6[2],0,(ulong)*(ushort *)((long)puVar6 + 0xc));
  }
  else {
    uVar12 = 0;
  }
LAB_0010f840:
  if (uVar18 != 0) {
    lVar10 = *(long *)((long)voidhandle + 0x60);
    *new_bid = (ulong)(sb_no * 0x20 + 0x20 | (uint)uVar12) << 0x30 |
               *(ulong *)(lVar10 + uVar18 * 0x18);
    local_58 = (void *)((long)local_58 + *(uint *)(lVar10 + 8 + uVar18 * 0x18) * uVar12);
  }
  return local_58;
LAB_0010f8a9:
  *(uint *)(lVar9 + -0x18) = -(uint)(uVar18 == 0) | sb_no;
  goto LAB_0010f8ac;
}

Assistant:

void * btreeblk_enlarge_node(void *voidhandle,
                             bid_t old_bid,
                             size_t req_size,
                             bid_t *new_bid)
{
    uint32_t i;
    bid_t bid;
    size_t src_sb, src_idx, src_nitems;
    size_t dst_sb, dst_idx, dst_nitems;
    void *src_addr, *dst_addr;
    struct btreeblk_handle *handle = (struct btreeblk_handle *)voidhandle;

    if (!is_subblock(old_bid)) {
        return NULL;
    }
    src_addr = dst_addr = NULL;
    subbid2bid(old_bid, &src_sb, &src_idx, &bid);

    dst_sb = 0;
    // find sublock that can accommodate req_size
    for (i=src_sb+1; i<handle->nsb; ++i){
        if (handle->sb[i].sb_size > req_size) {
            dst_sb = i;
            break;
        }
    }

    src_nitems = 0;
    for (i=0;i<handle->sb[src_sb].nblocks;++i){
        if (handle->sb[src_sb].bitmap[i]) {
            src_nitems++;
        }
    }

    dst_nitems = 0;
    if (dst_sb > 0) {
        dst_idx = handle->sb[dst_sb].nblocks;
        for (i=0;i<handle->sb[dst_sb].nblocks;++i){
            if (handle->sb[dst_sb].bitmap[i]) {
                dst_nitems++;
            } else if (dst_idx == handle->sb[dst_sb].nblocks) {
                dst_idx = i;
            }
        }
    }

    if (dst_nitems == 0) {
        // destination block is empty
        dst_idx = 0;
        if (src_nitems == 1 &&
            bid == handle->sb[src_sb].bid &&
            filemgr_is_writable(handle->file, bid)) {
            //2 case 1
            // if there's only one subblock in the source block, and
            // the source block is still writable and allocable,
            // then switch source block to destination block
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);
            dst_addr = src_addr;
            if (dst_sb > 0) {
                handle->sb[dst_sb].bid = handle->sb[src_sb].bid;
            } else {
                *new_bid = handle->sb[src_sb].bid;
            }
            btreeblk_set_dirty(voidhandle, handle->sb[src_sb].bid);
            // we MUST change block->sb_no value since subblock is switched.
            // dst_sb == 0: regular block, otherwise: sub-block
            _btreeblk_set_sb_no(voidhandle, handle->sb[src_sb].bid,
                                ((dst_sb)?(dst_sb):(-1)));

            if (src_idx > 0 || dst_addr != src_addr) {
                // move node to the beginning of the block
                memmove(dst_addr,
                        (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                        handle->sb[src_sb].sb_size);
            }
            if (dst_sb > 0) {
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            }
            if (bid == handle->sb[src_sb].bid) {
                // remove existing source block info
                handle->sb[src_sb].bid = BLK_NOT_FOUND;
                memset(handle->sb[src_sb].bitmap, 0,
                       handle->sb[src_sb].nblocks);
            }

        } else {
            //2 case 2
            // if there are more than one subblock in the source block,
            // or no more subblock is allocable from the current source block,
            // then allocate a new destination block and move the target subblock only.
            src_addr = _btreeblk_read(voidhandle, bid, src_sb);

            if (dst_sb > 0) {
                // case 2-1: enlarged block will be also a subblock
                dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
                memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
                handle->sb[dst_sb].bitmap[dst_idx] = 1;
            } else {
                // case 2-2: enlarged block will be a regular block
                dst_addr = btreeblk_alloc(voidhandle, new_bid);
                memcpy((uint8_t*)dst_addr,
                       (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
                       handle->sb[src_sb].sb_size);
            }

            // Mark the source subblock as stale.
            if (bid == handle->sb[src_sb].bid) {
                // The current source block may be still allocable.
                // Remove the corresponding bitmap from the source bitmap.
                // All unused subblocks will be marked as stale when this block
                // becomes immutable.
                handle->sb[src_sb].bitmap[src_idx] = 0;

                // TODO: what if FDB handle is closed without fdb_commit() ?
            } else if (bid != BLK_NOT_FOUND) {
                // The current source block will not be used for allocation anymore.
                // Mark the corresponding subblock as stale.
                _btreeblk_add_stale_block(handle,
                    (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                    handle->sb[src_sb].sb_size);
            }
        }
    } else {
        //2 case 3
        // destination block exists
        // (happens only when the destination block is
        //  a parent block of subblock set)
        src_addr = _btreeblk_read(voidhandle, bid, src_sb);
        if (filemgr_is_writable(handle->file, handle->sb[dst_sb].bid) &&
            dst_idx != handle->sb[dst_sb].nblocks) {
            // case 3-1
            dst_addr = _btreeblk_read(voidhandle, handle->sb[dst_sb].bid, dst_sb);
            btreeblk_set_dirty(voidhandle, handle->sb[dst_sb].bid);
        } else {
            // case 3-2: allocate new destination block
            dst_addr = _btreeblk_alloc(voidhandle, &handle->sb[dst_sb].bid, dst_sb);
            memset(handle->sb[dst_sb].bitmap, 0, handle->sb[dst_sb].nblocks);
            dst_idx = 0;
        }

        memcpy((uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx,
               (uint8_t*)src_addr + handle->sb[src_sb].sb_size * src_idx,
               handle->sb[src_sb].sb_size);
        handle->sb[dst_sb].bitmap[dst_idx] = 1;

        // Mark the source subblock as stale.
        if (bid == handle->sb[src_sb].bid) {
            // The current source block may be still allocable.
            // Remove the corresponding bitmap from the source bitmap.
            // All unused subblocks will be marked as stale when this block
            // becomes immutable.
            handle->sb[src_sb].bitmap[src_idx] = 0;
        } else if (handle->sb[src_sb].bid != BLK_NOT_FOUND) {
            // The current source block will not be used for allocation anymore.
            // Mark the corresponding subblock as stale.
            _btreeblk_add_stale_block(handle,
                (bid * handle->nodesize) + (src_idx * handle->sb[src_sb].sb_size),
                handle->sb[src_sb].sb_size);
        }

    }

    if (dst_sb > 0) {
        // sub block
        bid2subbid(handle->sb[dst_sb].bid, dst_sb, dst_idx, new_bid);
        return (uint8_t*)dst_addr + handle->sb[dst_sb].sb_size * dst_idx;
    } else {
        // whole block
        return dst_addr;
    }
}